

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::PrintValue<pstore::gsl::span<int,_1l>,void>
               (span<int,__1L> *container,ostream *os)

{
  bool bVar1;
  reference ptVar2;
  long lVar3;
  iterator __begin0;
  iterator __end0;
  char local_51;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_50;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_40;
  
  local_50.span_._0_1_ = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            (&local_50,container,0);
  pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            (&local_40,container,(container->storage_).super_extent_type<_1L>.size_);
  if (((span<int,__1L> *)CONCAT71(local_50.span_._1_7_,local_50.span_._0_1_) != local_40.span_) ||
     (local_50.index_ != local_40.index_)) {
    lVar3 = 0;
    do {
      ptVar2 = pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::operator*
                         (&local_50);
      if (lVar3 == 0) {
LAB_001328d2:
        local_51 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_51,1);
        std::ostream::operator<<((ostream *)os,*ptVar2);
        lVar3 = lVar3 + 1;
        bVar1 = true;
      }
      else {
        local_51 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_51,1);
        if (lVar3 != 0x20) goto LAB_001328d2;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar3 = 0x20;
        bVar1 = false;
      }
      if (!bVar1) break;
      pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::operator++(&local_50)
      ;
    } while (((span<int,__1L> *)CONCAT71(local_50.span_._1_7_,local_50.span_._0_1_) !=
              local_40.span_) || (local_50.index_ != local_40.index_));
    if (lVar3 != 0) {
      local_50.span_._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
    }
  }
  local_50.span_._0_1_ = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }